

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts3InsertDocsize(int *pRC,Fts3Table *p,u32 *aSz)

{
  int iVar1;
  sqlite3_stmt *psStack_38;
  int rc;
  sqlite3_stmt *pStmt;
  char *pcStack_28;
  int nBlob;
  char *pBlob;
  u32 *aSz_local;
  Fts3Table *p_local;
  int *pRC_local;
  
  if (*pRC == 0) {
    pBlob = (char *)aSz;
    aSz_local = (u32 *)p;
    p_local = (Fts3Table *)pRC;
    pcStack_28 = (char *)sqlite3_malloc64((long)p->nColumn * 10);
    if (pcStack_28 == (char *)0x0) {
      *(undefined4 *)&(p_local->base).pModule = 7;
    }
    else {
      fts3EncodeIntArray(aSz_local[0xc],(u32 *)pBlob,pcStack_28,(int *)((long)&pStmt + 4));
      iVar1 = fts3SqlStmt((Fts3Table *)aSz_local,0x14,&stack0xffffffffffffffc8,(sqlite3_value **)0x0
                         );
      if (iVar1 == 0) {
        sqlite3_bind_int64(psStack_38,1,*(sqlite_int64 *)(aSz_local + 0x7e));
        sqlite3_bind_blob(psStack_38,2,pcStack_28,pStmt._4_4_,sqlite3_free);
        sqlite3_step(psStack_38);
        iVar1 = sqlite3_reset(psStack_38);
        *(int *)&(p_local->base).pModule = iVar1;
      }
      else {
        sqlite3_free(pcStack_28);
        *(int *)&(p_local->base).pModule = iVar1;
      }
    }
  }
  return;
}

Assistant:

static void fts3InsertDocsize(
  int *pRC,                       /* Result code */
  Fts3Table *p,                   /* Table into which to insert */
  u32 *aSz                        /* Sizes of each column, in tokens */
){
  char *pBlob;             /* The BLOB encoding of the document size */
  int nBlob;               /* Number of bytes in the BLOB */
  sqlite3_stmt *pStmt;     /* Statement used to insert the encoding */
  int rc;                  /* Result code from subfunctions */

  if( *pRC ) return;
  pBlob = sqlite3_malloc64( 10*(sqlite3_int64)p->nColumn );
  if( pBlob==0 ){
    *pRC = SQLITE_NOMEM;
    return;
  }
  fts3EncodeIntArray(p->nColumn, aSz, pBlob, &nBlob);
  rc = fts3SqlStmt(p, SQL_REPLACE_DOCSIZE, &pStmt, 0);
  if( rc ){
    sqlite3_free(pBlob);
    *pRC = rc;
    return;
  }
  sqlite3_bind_int64(pStmt, 1, p->iPrevDocid);
  sqlite3_bind_blob(pStmt, 2, pBlob, nBlob, sqlite3_free);
  sqlite3_step(pStmt);
  *pRC = sqlite3_reset(pStmt);
}